

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_54::YieldPromiseNode::get(YieldPromiseNode *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::_::Void> *this_00;
  Void local_181;
  ExceptionOr<kj::_::Void> local_180;
  ExceptionOrValue *local_18;
  ExceptionOrValue *output_local;
  YieldPromiseNode *this_local;
  
  local_18 = output;
  output_local = (ExceptionOrValue *)this;
  _::ExceptionOr<kj::_::Void>::ExceptionOr(&local_180,&local_181);
  this_00 = _::ExceptionOrValue::as<kj::_::Void>(local_18);
  _::ExceptionOr<kj::_::Void>::operator=(this_00,&local_180);
  _::ExceptionOr<kj::_::Void>::~ExceptionOr(&local_180);
  return;
}

Assistant:

void get(_::ExceptionOrValue& output) noexcept override {
    output.as<_::Void>() = _::Void();
  }